

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O0

void __thiscall UnitTest_semantic4::Run(UnitTest_semantic4 *this)

{
  UnitTestBase *this_00;
  MemberAccessor *error;
  Terminator *pTVar1;
  FindName *in_RDI;
  Terminator *a;
  Terminator *t;
  MemberAccessor *t_m;
  MemberAccessor *t_m_n;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> ast;
  string *in_stack_fffffffffffffdf8;
  allocator *paVar2;
  FindName *in_stack_fffffffffffffe00;
  allocator *in_stack_fffffffffffffe10;
  anon_class_1_0_00000001_for_finder_ *in_stack_fffffffffffffe28;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_fffffffffffffe30;
  allocator *paVar3;
  string *in_stack_fffffffffffffe38;
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [64];
  Terminator *local_c0;
  allocator local_b1;
  string local_b0 [64];
  Terminator *local_70;
  MemberAccessor *local_60;
  UnitTestBase *local_50;
  allocator local_31;
  string local_30 [48];
  
  paVar2 = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"t.m.n = a",paVar2);
  anon_unknown.dwarf_fc1b::Semantic(in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  this_00 = (UnitTestBase *)
            ASTFind<luna::MemberAccessor,UnitTest_semantic4::Run()::__0>
                      (in_stack_fffffffffffffe30,
                       (anon_class_1_0_00000001_for_finder_ *)in_stack_fffffffffffffe28);
  local_50 = this_00;
  error = ASTFind<luna::MemberAccessor,UnitTest_semantic4::Run()::__1>
                    (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  paVar3 = &local_b1;
  local_60 = error;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"t",paVar3);
  FindName::FindName(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  pTVar1 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)paVar2
                      ,in_RDI);
  FindName::~FindName((FindName *)0x1a46c9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  local_70 = pTVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"a",&local_101);
  FindName::FindName(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  pTVar1 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)paVar2
                      ,in_RDI);
  FindName::~FindName((FindName *)0x1a475d);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  local_c0 = pTVar1;
  if (*(int *)&(local_50->errors_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish != 2) {
    in_stack_fffffffffffffe10 = &local_129;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_128,"\'t_m_n->semantic_ == luna::SemanticOp_Write\'",in_stack_fffffffffffffe10)
    ;
    UnitTestBase::Error(this_00,(string *)error);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
  }
  if (local_60->semantic_ != SemanticOp_Read) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"\'t_m->semantic_ == luna::SemanticOp_Read\'",&local_151)
    ;
    UnitTestBase::Error(this_00,(string *)error);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
  }
  if (local_70->semantic_ != SemanticOp_Read) {
    paVar2 = &local_179;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"\'t->semantic_ == luna::SemanticOp_Read\'",paVar2);
    UnitTestBase::Error(this_00,(string *)error);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
  }
  if (local_c0->semantic_ != SemanticOp_Read) {
    paVar2 = &local_1a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"\'a->semantic_ == luna::SemanticOp_Read\'",paVar2);
    UnitTestBase::Error(this_00,(string *)error);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  }
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_fffffffffffffe10);
  return;
}

Assistant:

TEST_CASE(semantic4)
{
    auto ast = Semantic("t.m.n = a");
    auto t_m_n = ASTFind<luna::MemberAccessor>(ast, [](luna::MemberAccessor *ma) {
        return ma->member_.str_->GetStdString() == "n";
    });
    auto t_m = ASTFind<luna::MemberAccessor>(ast, [](luna::MemberAccessor *ma) {
        return ma->member_.str_->GetStdString() == "m";
    });
    auto t = ASTFind<luna::Terminator>(ast, FindName("t"));
    auto a = ASTFind<luna::Terminator>(ast, FindName("a"));
    EXPECT_TRUE(t_m_n->semantic_ == luna::SemanticOp_Write);
    EXPECT_TRUE(t_m->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(t->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(a->semantic_ == luna::SemanticOp_Read);
}